

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_on_rst_stream_received(nghttp2_session *session,nghttp2_frame *frame)

{
  int iVar1;
  int iVar2;
  nghttp2_session *session_00;
  nghttp2_session *in_RSI;
  nghttp2_frame *in_RDI;
  nghttp2_stream *stream;
  nghttp2_session *in_stack_00000008;
  int rv;
  nghttp2_session *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int32_t in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*(int *)&(in_RSI->streams).mem == 0) {
    iVar1 = session_handle_invalid_connection
                      ((nghttp2_session *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                       (int)((ulong)in_RSI >> 0x20),
                       (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  else {
    iVar1 = session_detect_idle_stream(in_stack_ffffffffffffffd8,0);
    if (iVar1 == 0) {
      session_00 = (nghttp2_session *)nghttp2_session_get_stream(in_RSI,in_stack_ffffffffffffffe4);
      if (session_00 != (nghttp2_session *)0x0) {
        nghttp2_stream_shutdown((nghttp2_stream *)session_00,NGHTTP2_SHUT_RD);
      }
      iVar1 = session_call_on_frame_received
                        (in_RSI,(nghttp2_frame *)
                                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      if (iVar1 == 0) {
        iVar1 = nghttp2_session_close_stream(in_stack_00000008,stream._4_4_,(uint32_t)stream);
        iVar2 = nghttp2_is_fatal(iVar1);
        if (iVar2 == 0) {
          iVar1 = session_update_stream_reset_ratelim(session_00);
        }
      }
    }
    else {
      iVar1 = session_handle_invalid_connection
                        ((nghttp2_session *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                         (int)((ulong)in_RSI >> 0x20),
                         (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
  }
  return iVar1;
}

Assistant:

int nghttp2_session_on_rst_stream_received(nghttp2_session *session,
                                           nghttp2_frame *frame) {
  int rv;
  nghttp2_stream *stream;
  if (frame->hd.stream_id == 0) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "RST_STREAM: stream_id == 0");
  }

  if (session_detect_idle_stream(session, frame->hd.stream_id)) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "RST_STREAM: stream in idle");
  }

  stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
  if (stream) {
    /* We may use stream->shut_flags for strict error checking. */
    nghttp2_stream_shutdown(stream, NGHTTP2_SHUT_RD);
  }

  rv = session_call_on_frame_received(session, frame);
  if (rv != 0) {
    return rv;
  }
  rv = nghttp2_session_close_stream(session, frame->hd.stream_id,
                                    frame->rst_stream.error_code);
  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  return session_update_stream_reset_ratelim(session);
}